

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_down_sah_builder.h
# Opt level: O2

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this)

{
  undefined8 uVar1;
  pointer pBVar2;
  int iVar3;
  undefined4 extraout_var;
  _Elt_pointer pWVar4;
  ulong uVar5;
  size_t sVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t i;
  size_t sVar10;
  ulong extraout_RDX;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pNVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  WorkItem first_item;
  WorkItem second_item;
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>_>
  stack;
  undefined4 extraout_var_00;
  
  sVar6 = (this->bboxes_)._M_extent._M_extent_value;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->prim_ids).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::reserve(&__return_storage_ptr__->nodes,(sVar6 * 2) / this->config_->min_leaf_size);
  std::
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  ::emplace_back<>(&__return_storage_ptr__->nodes);
  pNVar14 = (__return_storage_ptr__->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = (**this->_vptr_TopDownSahBuilder)(this);
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    *(undefined4 *)
     ((long)&stack.c.
             super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
             ._M_impl.super__Deque_impl_data._M_map + lVar7) = 0x7f7fffff;
  }
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    *(undefined4 *)((long)&first_item.node_id + lVar7) = 0xff7fffff;
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       stack.c.
       super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
       ._M_impl.super__Deque_impl_data._M_map;
  auVar16 = ZEXT464((uint)stack.c.
                          super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                          ._M_impl.super__Deque_impl_data._M_map_size);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = first_item.node_id;
  auVar20 = ZEXT464((uint)(float)first_item.begin);
  pBVar2 = (this->bboxes_)._M_ptr;
  sVar10 = 0;
  while (sVar6 != sVar10) {
    lVar7 = *(long *)(*(long *)CONCAT44(extraout_var,iVar3) + sVar10 * 8);
    sVar10 = sVar10 + 1;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)pBVar2[lVar7].min.values;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)pBVar2[lVar7].max.values;
    auVar27 = vminss_avx(auVar16._0_16_,ZEXT416((uint)pBVar2[lVar7].min.values[2]));
    auVar16 = ZEXT1664(auVar27);
    auVar27 = vmaxss_avx(auVar20._0_16_,ZEXT416((uint)pBVar2[lVar7].max.values[2]));
    auVar20 = ZEXT1664(auVar27);
    auVar17 = vminps_avx(auVar17,auVar23);
    auVar21 = vmaxps_avx(auVar21,auVar26);
  }
  auVar21 = vunpcklps_avx(auVar17,auVar21);
  *(undefined1 (*) [16])pNVar14[-1].bounds._M_elems = auVar21;
  pNVar14[-1].bounds._M_elems[4] = auVar16._0_4_;
  pNVar14[-1].bounds._M_elems[5] = auVar20._0_4_;
  std::
  stack<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>>
  ::
  stack<std::deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>,void>
            (&stack);
  first_item.node_id = 0;
  first_item.begin._0_4_ = 0.0;
  first_item.begin._4_4_ = 0;
  first_item.end._0_4_ = (undefined4)sVar6;
  first_item.end._4_4_ = (float)(sVar6 >> 0x20);
  std::
  deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
  ::emplace_back<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>
            ((deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem,std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::WorkItem>>
              *)&stack,&first_item);
  do {
    while( true ) {
      if (stack.c.
          super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.
          super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        iVar3 = (**this->_vptr_TopDownSahBuilder)(this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&__return_storage_ptr__->prim_ids,iVar3);
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::_M_shrink_to_fit(&__return_storage_ptr__->nodes);
        std::
        _Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
        ::~_Deque_base((_Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                        *)&stack);
        return __return_storage_ptr__;
      }
      pWVar4 = stack.c.
               super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.
          super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.
          super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar4 = stack.c.
                 super__Deque_base<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      sVar6 = pWVar4[-1].node_id;
      sVar10 = pWVar4[-1].begin;
      uVar13 = pWVar4[-1].end;
      std::
      deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
      ::pop_back(&stack.c);
      pNVar14 = (__return_storage_ptr__->nodes).
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar6;
      if (this->config_->min_leaf_size < uVar13 - sVar10) break;
      if (uVar13 == sVar10) {
        __assert_fail("prim_count != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/index.h"
                      ,0x41,
                      "static Index<Bits, PrimCountBits> bvh::v2::Index<32, 4>::make_leaf(size_t, size_t) [Bits = 32, PrimCountBits = 4]"
                     );
      }
LAB_0010a519:
      Index<32UL,_4UL>::Index((Index<32UL,_4UL> *)&first_item,sVar10,uVar13 - sVar10);
      (pNVar14->index).value = (Type)first_item.node_id;
    }
    first_item.begin._0_4_ = (pNVar14->bounds)._M_elems[4];
    first_item.end._4_4_ = (pNVar14->bounds)._M_elems[5];
    auVar21 = vinsertps_avx(ZEXT416((uint)(pNVar14->bounds)._M_elems[0]),
                            ZEXT416((uint)(pNVar14->bounds)._M_elems[2]),0x10);
    auVar17 = vinsertps_avx(ZEXT416((uint)(pNVar14->bounds)._M_elems[1]),
                            ZEXT416((uint)(pNVar14->bounds)._M_elems[3]),0x10);
    first_item.node_id = vmovlps_avx(auVar21);
    uVar1 = vmovlps_avx(auVar17);
    first_item.begin._4_4_ = (undefined4)uVar1;
    first_item.end._0_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    iVar3 = (*this->_vptr_TopDownSahBuilder[1])(this,&first_item,sVar10,uVar13);
    uVar5 = CONCAT44(extraout_var_00,iVar3);
    if ((extraout_RDX & 1) == 0) goto LAB_0010a519;
    lVar7 = (long)(__return_storage_ptr__->nodes).
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->nodes).
                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = lVar7 / 0x1c;
    Index<32UL,_4UL>::Index((Index<32UL,_4UL> *)&first_item,sVar6,0);
    (pNVar14->index).value = (Type)first_item.node_id;
    std::
    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
    ::resize(&__return_storage_ptr__->nodes,sVar6 + 2);
    iVar3 = (**this->_vptr_TopDownSahBuilder)();
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)&first_item.node_id + lVar8) = 0x7f7fffff;
    }
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)&second_item.node_id + lVar8) = 0xff7fffff;
    }
    auVar24._8_8_ = 0;
    auVar24._0_8_ = first_item.node_id;
    auVar16 = ZEXT464((uint)(float)first_item.begin);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = second_item.node_id;
    auVar20 = ZEXT464((uint)second_item.begin);
    pBVar2 = (this->bboxes_)._M_ptr;
    sVar11 = sVar10;
    while( true ) {
      auVar21 = auVar16._0_16_;
      auVar17 = auVar20._0_16_;
      if (uVar5 <= sVar11) break;
      lVar8 = *(long *)(*(long *)CONCAT44(extraout_var_01,iVar3) + sVar11 * 8);
      sVar11 = sVar11 + 1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)pBVar2[lVar8].min.values;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)pBVar2[lVar8].max.values;
      auVar21 = vminss_avx(auVar21,ZEXT416((uint)pBVar2[lVar8].min.values[2]));
      auVar16 = ZEXT1664(auVar21);
      auVar21 = vmaxss_avx(auVar17,ZEXT416((uint)pBVar2[lVar8].max.values[2]));
      auVar20 = ZEXT1664(auVar21);
      auVar24 = vminps_avx(auVar24,auVar15);
      auVar27 = vmaxps_avx(auVar27,auVar18);
    }
    iVar3 = (**this->_vptr_TopDownSahBuilder)();
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)&first_item.node_id + lVar8) = 0x7f7fffff;
    }
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(undefined4 *)((long)&second_item.node_id + lVar8) = 0xff7fffff;
    }
    auVar19._8_8_ = 0;
    auVar19._0_8_ = first_item.node_id;
    auVar16 = ZEXT464((uint)(float)first_item.begin);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = second_item.node_id;
    auVar20 = ZEXT464((uint)second_item.begin);
    pBVar2 = (this->bboxes_)._M_ptr;
    uVar12 = uVar5;
    while( true ) {
      auVar23 = auVar16._0_16_;
      auVar26 = auVar20._0_16_;
      if (uVar13 <= uVar12) break;
      lVar8 = *(long *)(*(long *)CONCAT44(extraout_var_02,iVar3) + uVar12 * 8);
      uVar12 = uVar12 + 1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)pBVar2[lVar8].min.values;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)pBVar2[lVar8].max.values;
      auVar23 = vminss_avx(auVar23,ZEXT416((uint)pBVar2[lVar8].min.values[2]));
      auVar16 = ZEXT1664(auVar23);
      auVar23 = vmaxss_avx(auVar26,ZEXT416((uint)pBVar2[lVar8].max.values[2]));
      auVar20 = ZEXT1664(auVar23);
      auVar19 = vminps_avx(auVar19,auVar25);
      auVar22 = vmaxps_avx(auVar22,auVar28);
    }
    auVar25 = vinsertps_avx(auVar17,auVar26,0x10);
    auVar28 = vinsertps_avx(auVar21,auVar23,0x10);
    auVar28 = vsubps_avx(auVar25,auVar28);
    auVar29 = vsubps_avx(auVar22,auVar19);
    auVar15 = vunpcklps_avx(auVar19,auVar22);
    auVar22 = vsubps_avx(auVar27,auVar24);
    auVar19 = vinsertps_avx(auVar22,auVar29,0x1c);
    auVar25 = vinsertps_avx(auVar29,auVar22,0x4c);
    auVar22 = vhaddps_avx(auVar22,auVar29);
    auVar29._0_4_ = auVar25._0_4_ * auVar19._0_4_;
    auVar29._4_4_ = auVar25._4_4_ * auVar19._4_4_;
    auVar29._8_4_ = auVar25._8_4_ * auVar19._8_4_;
    auVar29._12_4_ = auVar25._12_4_ * auVar19._12_4_;
    auVar22 = vshufps_avx(auVar22,auVar22,0xe8);
    auVar22 = vfmadd213ps_fma(auVar22,auVar28,auVar29);
    auVar24 = vunpcklps_avx(auVar24,auVar27);
    auVar27 = vmovshdup_avx(auVar22);
    uVar12 = uVar5;
    uVar9 = sVar10;
    second_item.begin = uVar5;
    auVar19 = auVar15;
    auVar25 = auVar17;
    auVar28 = auVar21;
    if (auVar22._0_4_ < auVar27._0_4_) {
      uVar12 = uVar13;
      uVar9 = uVar5;
      second_item.begin = sVar10;
      uVar13 = uVar5;
      auVar19 = auVar24;
      auVar24 = auVar15;
      auVar25 = auVar26;
      auVar28 = auVar23;
      auVar23 = auVar21;
      auVar26 = auVar17;
    }
    pNVar14 = (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    second_item.node_id = sVar6 + 1;
    first_item.begin._0_4_ = (float)uVar9;
    first_item.begin._4_4_ = (undefined4)(uVar9 >> 0x20);
    first_item.end._0_4_ = (undefined4)uVar12;
    first_item.end._4_4_ = (float)(uVar12 >> 0x20);
    *(undefined1 (*) [16])((long)pNVar14 + lVar7) = auVar24;
    *(int *)((long)pNVar14 + lVar7 + 0x10) = auVar28._0_4_;
    *(int *)((long)pNVar14 + lVar7 + 0x14) = auVar25._0_4_;
    *(undefined1 (*) [16])pNVar14[second_item.node_id].bounds._M_elems = auVar19;
    pNVar14[second_item.node_id].bounds._M_elems[4] = auVar23._0_4_;
    pNVar14[second_item.node_id].bounds._M_elems[5] = auVar26._0_4_;
    first_item.node_id = sVar6;
    second_item.end = uVar13;
    if (uVar12 - uVar9 < uVar13 - second_item.begin) {
      first_item.begin._0_4_ = (float)second_item.begin;
      first_item.begin._4_4_ = (undefined4)(second_item.begin >> 0x20);
      first_item.end._0_4_ = (undefined4)uVar13;
      first_item.end._4_4_ = (float)(uVar13 >> 0x20);
      first_item.node_id = second_item.node_id;
      second_item.node_id = sVar6;
      second_item.begin = uVar9;
      second_item.end = uVar12;
    }
    std::
    deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
    ::push_back(&stack.c,&first_item);
    std::
    deque<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem,_std::allocator<bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::WorkItem>_>
    ::push_back(&stack.c,&second_item);
  } while( true );
}

Assistant:

Bvh<Node> build() {
        const auto prim_count = bboxes_.size();

        Bvh<Node> bvh;
        bvh.nodes.reserve((2 * prim_count) / config_.min_leaf_size);
        bvh.nodes.emplace_back();
        bvh.nodes.back().set_bbox(compute_bbox(0, prim_count));

        std::stack<WorkItem> stack;
        stack.push(WorkItem { 0, 0, prim_count });
        while (!stack.empty()) {
            auto item = stack.top();
            stack.pop();

            auto& node = bvh.nodes[item.node_id];
            if (item.size() > config_.min_leaf_size) {
                if (auto split_pos = try_split(node.get_bbox(), item.begin, item.end)) {
                    auto first_child = bvh.nodes.size();
                    node.index = Node::Index::make_inner(first_child);

                    bvh.nodes.resize(first_child + 2);

                    auto first_bbox   = compute_bbox(item.begin, *split_pos);
                    auto second_bbox  = compute_bbox(*split_pos, item.end);
                    auto first_range  = std::make_pair(item.begin, *split_pos);
                    auto second_range = std::make_pair(*split_pos, item.end);

                    // For "any-hit" queries, the left child is chosen first, so we make sure that
                    // it is the child with the largest area, as it is more likely to contain an
                    // an occluder. See "SATO: Surface Area Traversal Order for Shadow Ray Tracing",
                    // by J. Nah and D. Manocha.
                    if (first_bbox.get_half_area() < second_bbox.get_half_area()) {
                        std::swap(first_bbox, second_bbox);
                        std::swap(first_range, second_range);
                    }

                    auto first_item  = WorkItem { first_child + 0, first_range.first, first_range.second };
                    auto second_item = WorkItem { first_child + 1, second_range.first, second_range.second };
                    bvh.nodes[first_child + 0].set_bbox(first_bbox);
                    bvh.nodes[first_child + 1].set_bbox(second_bbox);

                    // Process the largest child item first, in order to minimize the stack size.
                    if (first_item.size() < second_item.size())
                        std::swap(first_item, second_item);

                    stack.push(first_item);
                    stack.push(second_item);
                    continue;
                }
            }

            node.index = Node::Index::make_leaf(item.begin, item.size());
        }

        bvh.prim_ids = std::move(get_prim_ids());
        bvh.nodes.shrink_to_fit();
        return bvh;
    }